

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# payment.cpp
# Opt level: O0

void handlePostJointResponse(json *receivedObject,char *tag)

{
  bool bVar1;
  int iVar2;
  reference this;
  char *__s1;
  string_t local_a0;
  char *local_80;
  char *response;
  undefined1 local_70 [4];
  int id;
  string strId;
  allocator<char> local_39;
  string local_38 [8];
  string stringTag;
  char *tag_local;
  json *receivedObject_local;
  
  stringTag.field_2._8_8_ = tag;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,tag,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::substr((ulong)local_70,(ulong)local_38);
  response._4_4_ = std::__cxx11::stoi((string *)local_70,(size_t *)0x0,10);
  this = nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     *)receivedObject,"response");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_a0,this,-1,' ',false,strict);
  __s1 = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::~string((string *)&local_a0);
  local_80 = __s1;
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,"accepted");
    if (iVar2 == 0) {
      if (_cbPaymentResult != (cbPaymentResult)0x0) {
        (*_cbPaymentResult)(response._4_4_,9,(char *)0x50cb90);
      }
      bufferPayment.isFree = true;
    }
    else {
      bVar1 = std::type_info::operator==
                        ((type_info *)
                         &nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::typeinfo,
                         (type_info *)
                         &nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::typeinfo);
      if (bVar1) {
        if (_cbPaymentResult != (cbPaymentResult)0x0) {
          (*_cbPaymentResult)(response._4_4_,10,(char *)0x50cb90);
        }
        bufferPayment.isFree = true;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void handlePostJointResponse(nlohmann::json receivedObject, const char * tag){
	std::string stringTag = tag;
	std::string strId = stringTag.substr(10);
	int id = stoi(strId);
	const char * response = receivedObject["response"].dump().c_str();
	if (response != nullptr){
		if (strcmp(response, "accepted") == 0){
			if(_cbPaymentResult){
				_cbPaymentResult(id, PAYMENT_ACKNOWLEDGED, bufferPayment.unit);
			}
			bufferPayment.isFree = true;
		} else {
			if (typeid(receivedObject["error"]) == typeid(nlohmann::json)){
				if(_cbPaymentResult){
					_cbPaymentResult(id, PAYMENT_REFUSED, bufferPayment.unit);
				}
				bufferPayment.isFree = true;
			}
		}
	} 
}